

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  char *pcVar1;
  int count;
  String SVar2;
  String counts;
  TimeInMillis local_30;
  String local_28;
  
  if (FLAGS_gtest_print_time == '\x01') {
    String::operator=(&this->test_case_name_,(test_case->name_).c_str_);
    count = TestCase::test_to_run_count(test_case);
    SVar2 = FormatCountableNoun((testing *)&counts,count,"test","tests");
    ColoredPrintf(COLOR_GREEN,"[----------] ",SVar2.length_);
    pcVar1 = (this->test_case_name_).c_str_;
    local_30 = test_case->elapsed_time_;
    StreamableToString<long_long>((internal *)&local_28,&local_30);
    printf("%s from %s (%s ms total)\n\n",counts.c_str_,pcVar1,local_28.c_str_);
    String::~String(&local_28);
    fflush(_stdout);
    String::~String(&counts);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case_name_.c_str(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}